

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O2

void __thiscall
BufferInputSource::BufferInputSource
          (BufferInputSource *this,string *description,Buffer *buf,bool own_memory)

{
  longlong lVar1;
  size_t local_20;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__BufferInputSource_002aeb00;
  this->own_memory = own_memory;
  std::__cxx11::string::string((string *)&this->description,(string *)description);
  this->buf = buf;
  this->cur_offset = 0;
  if (buf == (Buffer *)0x0) {
    lVar1 = 0;
  }
  else {
    local_20 = Buffer::getSize(buf);
    lVar1 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&local_20);
  }
  this->max_offset = lVar1;
  return;
}

Assistant:

BufferInputSource::BufferInputSource(std::string const& description, Buffer* buf, bool own_memory) :
    own_memory(own_memory),
    description(description),
    buf(buf),
    cur_offset(0),
    max_offset(buf ? QIntC::to_offset(buf->getSize()) : 0)
{
}